

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_slay(parser *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  angband_constants *paVar10;
  slay_conflict *psVar11;
  void *pvVar12;
  undefined8 *p_00;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  errr local_34;
  
  z_info->slay_max = '\0';
  pvVar12 = parser_priv(p);
  paVar10 = z_info;
  if (pvVar12 != (void *)0x0) {
    bVar13 = z_info->slay_max;
    do {
      if (0xfd < bVar13) {
        local_34 = 0x33;
        goto LAB_001859dd;
      }
      bVar13 = bVar13 + 1;
      paVar10->slay_max = bVar13;
      pvVar12 = *(void **)((long)pvVar12 + 0x38);
    } while (pvVar12 != (void *)0x0);
  }
  local_34 = 0;
LAB_001859dd:
  slays = (slay_conflict *)mem_zalloc((ulong)z_info->slay_max * 0x40 + 0x40);
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    uVar14 = 1;
    lVar15 = 0;
    do {
      psVar11 = slays;
      puVar2 = (undefined8 *)p_00[7];
      if (uVar14 <= z_info->slay_max) {
        uVar3 = *p_00;
        uVar4 = p_00[1];
        uVar5 = p_00[2];
        uVar6 = p_00[3];
        uVar7 = p_00[4];
        uVar8 = p_00[5];
        uVar9 = p_00[7];
        puVar1 = (undefined8 *)((long)&slays[1].o_multiplier + lVar15);
        *puVar1 = p_00[6];
        puVar1[1] = uVar9;
        puVar1 = (undefined8 *)((long)&psVar11[1].range_verb + lVar15);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        puVar1 = (undefined8 *)((long)&psVar11[1].base + lVar15);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        puVar1 = (undefined8 *)((long)&psVar11[1].code + lVar15);
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
        *(undefined8 *)((long)&slays[1].next + lVar15) = 0;
      }
      mem_free(p_00);
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x40;
      p_00 = puVar2;
    } while (puVar2 != (undefined8 *)0x0);
  }
  z_info->slay_max = z_info->slay_max + '\x01';
  parser_destroy(p);
  return local_34;
}

Assistant:

static errr finish_parse_slay(struct parser *p) {
	struct slay *slay, *next = NULL;
	int count = 1;
	errr result = PARSE_ERROR_NONE;

	/* Count the entries */
	z_info->slay_max = 0;
	slay = parser_priv(p);
	while (slay) {
		if (z_info->slay_max >= 254) {
			result = PARSE_ERROR_TOO_MANY_ENTRIES;
			break;
		}
		z_info->slay_max++;
		slay = slay->next;
	}

	/* Allocate the direct access list and copy the data to it */
	slays = mem_zalloc((z_info->slay_max + 1) * sizeof(*slay));
	for (slay = parser_priv(p); slay; slay = next, count++) {
		next = slay->next;
		if (count <= z_info->slay_max) {
			memcpy(&slays[count], slay, sizeof(*slay));
			slays[count].next = NULL;
		}
		mem_free(slay);
	}
	z_info->slay_max += 1;

	parser_destroy(p);
	return result;
}